

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::enum_<kratos::PortDirection>::enum_<>
          (enum_<kratos::PortDirection> *this,handle *scope,char *name)

{
  str_attr_accessor local_a8;
  arg local_88;
  is_method local_78;
  name local_70;
  is_new_style_constructor local_62;
  type local_61;
  cpp_function local_60;
  type local_53;
  type local_52;
  anon_class_1_0_00000001 local_51;
  arg local_50;
  anon_class_1_0_00000001 local_38;
  factory<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_pybind11_h:1862:18),_pybind11::detail::void_type_(*)(),_kratos::PortDirection_(int),_pybind11::detail::void_type_()>
  local_37;
  undefined1 local_36;
  undefined1 local_35;
  bool is_convertible;
  bool is_arithmetic;
  PyObject *local_28;
  char *local_20;
  char *name_local;
  handle *scope_local;
  enum_<kratos::PortDirection> *this_local;
  
  local_28 = scope->m_ptr;
  local_20 = name;
  name_local = (char *)scope;
  scope_local = (handle *)this;
  class_<kratos::PortDirection>::class_<>
            (&this->super_class_<kratos::PortDirection>,(handle)local_28,name);
  pybind11::detail::enum_base::enum_base(&this->m_base,(handle *)this,(handle *)name_local);
  local_35 = 0;
  local_36 = 0;
  pybind11::detail::enum_base::init(&this->m_base,(EVP_PKEY_CTX *)0x0);
  init<pybind11::enum_<kratos::PortDirection>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(int)_1_,pybind11::detail::initimpl::factory<pybind11::enum_<kratos::PortDirection>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(int)_1_,pybind11::detail::void_type(*)(),kratos::PortDirection(int),pybind11::detail::void_type()>>
            (&local_38);
  pybind11::arg::arg(&local_50,"value");
  class_<kratos::PortDirection>::
  def<pybind11::enum_<kratos::PortDirection>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(int)_1_,pybind11::detail::void_type(*)(),kratos::PortDirection(int),pybind11::detail::void_type(),pybind11::arg>
            (&this->super_class_<kratos::PortDirection>,&local_37,&local_50);
  class_<kratos::PortDirection>::
  def_property_readonly<pybind11::enum_<kratos::PortDirection>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(kratos::PortDirection)_1_>
            (&this->super_class_<kratos::PortDirection>,"value",&local_51);
  class_<kratos::PortDirection>::
  def<pybind11::enum_<kratos::PortDirection>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(kratos::PortDirection)_2_>
            (&this->super_class_<kratos::PortDirection>,"__int__",&local_52);
  class_<kratos::PortDirection>::
  def<pybind11::enum_<kratos::PortDirection>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(kratos::PortDirection)_3_>
            (&this->super_class_<kratos::PortDirection>,"__index__",&local_53);
  pybind11::name::name(&local_70,"__setstate__");
  is_method::is_method(&local_78,(handle *)this);
  pybind11::arg::arg(&local_88,"state");
  cpp_function::
  cpp_function<pybind11::enum_<kratos::PortDirection>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(pybind11::detail::value_and_holder&,int)_1_,pybind11::detail::is_new_style_constructor,pybind11::name,pybind11::is_method,pybind11::arg,void>
            (&local_60,&local_61,&local_62,&local_70,&local_78,&local_88);
  pybind11::detail::object_api<pybind11::handle>::attr
            (&local_a8,(object_api<pybind11::handle> *)this,"__setstate__");
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            (&local_a8,&local_60);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_a8);
  cpp_function::~cpp_function(&local_60);
  return;
}

Assistant:

enum_(const handle &scope, const char *name, const Extra&... extra)
      : class_<Type>(scope, name, extra...), m_base(*this, scope) {
        constexpr bool is_arithmetic = detail::any_of<std::is_same<arithmetic, Extra>...>::value;
        constexpr bool is_convertible = std::is_convertible<Type, Underlying>::value;
        m_base.init(is_arithmetic, is_convertible);

        def(init([](Scalar i) { return static_cast<Type>(i); }), arg("value"));
        def_property_readonly("value", [](Type value) { return (Scalar) value; });
        def("__int__", [](Type value) { return (Scalar) value; });
        #if PY_MAJOR_VERSION < 3
            def("__long__", [](Type value) { return (Scalar) value; });
        #endif
        #if PY_MAJOR_VERSION > 3 || (PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION >= 8)
            def("__index__", [](Type value) { return (Scalar) value; });
        #endif

        attr("__setstate__") = cpp_function(
            [](detail::value_and_holder &v_h, Scalar arg) {
                detail::initimpl::setstate<Base>(v_h, static_cast<Type>(arg),
                        Py_TYPE(v_h.inst) != v_h.type->type); },
            detail::is_new_style_constructor(),
            pybind11::name("__setstate__"), is_method(*this), arg("state"));
    }